

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

int generate_C_code(Ravi_CompilerInterface *ravi_interface,Proc *proc,TextBuffer *mb)

{
  undefined1 local_198 [8];
  PtrListIterator childprociter__;
  Proc *childproc;
  int i;
  BasicBlock *bb;
  Function fn;
  int rc;
  TextBuffer *mb_local;
  Proc *proc_local;
  Ravi_CompilerInterface *ravi_interface_local;
  
  fn.env[0].__saved_mask.__val[0xf]._4_4_ = 0;
  initfn((Function *)&bb,proc,ravi_interface);
  fn.env[0].__saved_mask.__val[0xf]._4_4_ = _setjmp((__jmp_buf_tag *)&fn.api);
  if (fn.env[0].__saved_mask.__val[0xf]._4_4_ == 0) {
    childproc._4_4_ = 0;
    while ((childproc._4_4_ < (int)proc->node_count &&
           (fn.env[0].__saved_mask.__val[0xf]._4_4_ =
                 output_basic_block((Function *)&bb,proc->nodes[childproc._4_4_]),
           fn.env[0].__saved_mask.__val[0xf]._4_4_ == 0))) {
      childproc._4_4_ = childproc._4_4_ + 1;
    }
    raviX_buffer_add_string((TextBuffer *)&fn.prologue.pos,"}\n");
    raviX_buffer_add_string(mb,(char *)fn.proc);
    raviX_buffer_add_string(mb,(char *)fn.prologue.pos);
  }
  cleanup((EVP_PKEY_CTX *)&bb);
  if (fn.env[0].__saved_mask.__val[0xf]._4_4_ == 0) {
    raviX_ptrlist_forward_iterator((PtrListIterator *)local_198,(PtrList *)proc->procs);
    childprociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_198);
    while (childprociter__._16_8_ != 0) {
      fn.env[0].__saved_mask.__val[0xf]._4_4_ =
           generate_C_code(ravi_interface,(Proc *)childprociter__._16_8_,mb);
      if (fn.env[0].__saved_mask.__val[0xf]._4_4_ != 0) {
        return fn.env[0].__saved_mask.__val[0xf]._4_4_;
      }
      childprociter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_198);
    }
    ravi_interface_local._4_4_ = 0;
  }
  else {
    ravi_interface_local._4_4_ = fn.env[0].__saved_mask.__val[0xf]._4_4_;
  }
  return ravi_interface_local._4_4_;
}

Assistant:

static int generate_C_code(struct Ravi_CompilerInterface *ravi_interface, Proc *proc, TextBuffer *mb)
{
	int rc = 0;
	{
		Function fn;
		initfn(&fn, proc, ravi_interface);
		rc = setjmp(fn.env);
		if (rc == 0) {
			BasicBlock *bb;
			for (int i = 0; i < (int)proc->node_count; i++) {
				bb = proc->nodes[i];
				rc = output_basic_block(&fn, bb);
				if (rc != 0)
					break;
			}

			raviX_buffer_add_string(&fn.body, "}\n");
			raviX_buffer_add_string(mb, fn.prologue.buf);
			raviX_buffer_add_string(mb, fn.body.buf);
		}
		cleanup(&fn);
	}
	if (rc != 0)
		return rc;

	Proc *childproc;
	FOR_EACH_PTR(proc->procs, Proc, childproc)
	{
		rc = generate_C_code(ravi_interface, childproc, mb);
		if (rc != 0)
			return rc;
	}
	END_FOR_EACH_PTR(childproc)
	return 0;
}